

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

void SHA256D64(uchar *out,uchar *in,size_t blocks)

{
  long lVar1;
  uchar *extraout_RDX;
  size_t sVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = blocks;
  if ((7 < blocks) && ((anonymous_namespace)::TransformD64_8way != 0)) {
    do {
      sha256d64_avx2::Transform_8way((sha256d64_avx2 *)out,in,(uchar *)blocks);
      out = (uchar *)((sha256d64_avx2 *)out + 0x100);
      in = in + 0x200;
      sVar2 = sVar2 - 8;
      blocks = (size_t)extraout_RDX;
    } while (7 < sVar2);
  }
  if ((3 < sVar2) && ((anonymous_namespace)::TransformD64_4way != 0)) {
    do {
      sha256d64_sse41::Transform_4way(out,in);
      out = (uchar *)((sha256d64_avx2 *)out + 0x80);
      in = in + 0x100;
      sVar2 = sVar2 - 4;
    } while (3 < sVar2);
  }
  if ((1 < sVar2) && ((anonymous_namespace)::TransformD64_2way != 0)) {
    do {
      sha256d64_x86_shani::Transform_2way(out,in);
      out = (uchar *)((sha256d64_avx2 *)out + 0x40);
      in = in + 0x80;
      sVar2 = sVar2 - 2;
    } while (1 < sVar2);
  }
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    (*(code *)(anonymous_namespace)::TransformD64)(out,in);
    out = (uchar *)((sha256d64_avx2 *)out + 0x20);
    in = in + 0x40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SHA256D64(unsigned char* out, const unsigned char* in, size_t blocks)
{
    if (TransformD64_8way) {
        while (blocks >= 8) {
            TransformD64_8way(out, in);
            out += 256;
            in += 512;
            blocks -= 8;
        }
    }
    if (TransformD64_4way) {
        while (blocks >= 4) {
            TransformD64_4way(out, in);
            out += 128;
            in += 256;
            blocks -= 4;
        }
    }
    if (TransformD64_2way) {
        while (blocks >= 2) {
            TransformD64_2way(out, in);
            out += 64;
            in += 128;
            blocks -= 2;
        }
    }
    while (blocks) {
        TransformD64(out, in);
        out += 32;
        in += 64;
        --blocks;
    }
}